

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

bool __thiscall Assimp::XGLImporter::ReadMesh(XGLImporter *this,TempScope *scope)

{
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *this_00;
  float *m;
  element_type *peVar1;
  aiVector2D aVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  float fVar8;
  uint uVar9;
  undefined4 extraout_var;
  mapped_type *pmVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar11;
  mapped_type *this_01;
  _Base_ptr p_Var12;
  uint uVar13;
  undefined1 uVar14;
  char cVar15;
  XGLImporter *this_02;
  bool *pbVar16;
  uint uVar17;
  undefined1 uVar18;
  uint i;
  ulong uVar19;
  TempFace *__x;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  aiVector3D aVar20;
  allocator<char> local_1d4;
  char local_1d3 [3];
  uint vcount;
  uint local_1cc;
  undefined1 local_1c8 [16];
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *local_1b8;
  TempScope *local_1b0;
  uint meshId;
  undefined4 uStack_1a4;
  string local_188;
  TempFace tf [3];
  map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
  bymat;
  TempMesh t;
  
  t.points._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &t.points._M_t._M_impl.super__Rb_tree_header._M_header;
  t.points._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t.points._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  t.points._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  t.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &t.normals._M_t._M_impl.super__Rb_tree_header._M_header;
  t.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  t.normals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  t.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &t.uvs._M_t._M_impl.super__Rb_tree_header._M_header;
  t.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  t.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  t.uvs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bymat._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bymat._M_t._M_impl.super__Rb_tree_header._M_header;
  bymat._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bymat._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bymat._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0 = scope;
  bymat._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bymat._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  t.points._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       t.points._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  t.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       t.normals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  t.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       t.uvs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1cc = ReadIDAttr(this);
  do {
    bVar6 = ReadElementUpToClosing(this,"mesh");
    if (!bVar6) {
      m = &tf[0].pos.z;
      this_00 = &local_1b0->meshes_linear;
      for (p_Var12 = bymat._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var12 != &bymat._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        this_02 = (XGLImporter *)tf;
        std::pair<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>::
        pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_true>
                  ((pair<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh> *)tf,
                   (pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh> *)(p_Var12 + 1))
        ;
        _meshId = (pointer)ToOutputMesh(this_02,(TempMaterialMesh *)m);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(this_00,(value_type *)&meshId);
        if (local_1cc != 0xffffffff) {
          local_188._M_dataplus._M_p._0_4_ = local_1cc;
          local_188._M_string_length = (size_type)_meshId;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMesh*>,std::_Select1st<std::pair<unsigned_int_const,aiMesh*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMesh*>>>
          ::_M_emplace_equal<std::pair<unsigned_int,aiMesh*>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,aiMesh*>,std::_Select1st<std::pair<unsigned_int_const,aiMesh*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,aiMesh*>>>
                      *)local_1b0,(pair<unsigned_int,_aiMesh_*> *)&local_188);
        }
        TempMaterialMesh::~TempMaterialMesh((TempMaterialMesh *)m);
      }
      bVar6 = local_1cc == 0xffffffff;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
      ::~_Rb_tree(&bymat._M_t);
      TempMesh::~TempMesh(&t);
      return bVar6;
    }
    GetElementName_abi_cxx11_(&local_188,this);
    bVar6 = std::operator==(&local_188,"mat");
    if (bVar6) {
      ReadMaterial(this,local_1b0);
    }
    else {
      bVar6 = std::operator==(&local_188,"p");
      if (bVar6) {
        peVar1 = (this->m_reader).
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar7 = (*peVar1->_vptr_IIrrXMLReader[7])(peVar1,"ID");
        if (CONCAT44(extraout_var,iVar7) == 0) {
LAB_0050d2f3:
          LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x50d2f8);
        }
        else {
          peVar1 = (this->m_reader).
                   super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          fVar8 = (float)(*peVar1->_vptr_IIrrXMLReader[9])(peVar1,"ID");
          aVar20 = ReadVec3(this);
          local_1c8._8_4_ = extraout_XMM0_Dc;
          local_1c8._0_8_ = aVar20._0_8_;
          local_1c8._12_4_ = extraout_XMM0_Dd;
          local_1b8 = (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                      CONCAT44(local_1b8._4_4_,aVar20.z);
          tf[0].pos.x = fVar8;
          pmVar10 = std::
                    map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                    ::operator[](&t.points,(key_type *)tf);
LAB_0050d268:
          auVar5 = local_1c8;
          pmVar10->x = (float)local_1c8._0_4_;
          pmVar10->y = (float)local_1c8._4_4_;
          pmVar10->z = local_1b8._0_4_;
          local_1c8 = auVar5;
        }
      }
      else {
        bVar6 = std::operator==(&local_188,"n");
        if (bVar6) {
          peVar1 = (this->m_reader).
                   super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar7 = (*peVar1->_vptr_IIrrXMLReader[7])(peVar1,"ID");
          if (CONCAT44(extraout_var_00,iVar7) == 0) goto LAB_0050d2f3;
          peVar1 = (this->m_reader).
                   super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          fVar8 = (float)(*peVar1->_vptr_IIrrXMLReader[9])(peVar1,"ID");
          aVar20 = ReadVec3(this);
          local_1c8._8_4_ = extraout_XMM0_Dc_00;
          local_1c8._0_8_ = aVar20._0_8_;
          local_1c8._12_4_ = extraout_XMM0_Dd_00;
          local_1b8 = (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                      CONCAT44(local_1b8._4_4_,aVar20.z);
          tf[0].pos.x = fVar8;
          pmVar10 = std::
                    map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                    ::operator[](&t.normals,(key_type *)tf);
          goto LAB_0050d268;
        }
        bVar6 = std::operator==(&local_188,"tc");
        if (bVar6) {
          peVar1 = (this->m_reader).
                   super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar7 = (*peVar1->_vptr_IIrrXMLReader[7])(peVar1,"ID");
          if (CONCAT44(extraout_var_01,iVar7) == 0) goto LAB_0050d2f3;
          peVar1 = (this->m_reader).
                   super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          fVar8 = (float)(*peVar1->_vptr_IIrrXMLReader[9])(peVar1,"ID");
          aVar2 = ReadVec2(this);
          local_1c8._8_4_ = extraout_XMM0_Dc_01;
          local_1c8._0_4_ = aVar2.x;
          local_1c8._4_4_ = aVar2.y;
          local_1c8._12_4_ = extraout_XMM0_Dd_01;
          tf[0].pos.x = fVar8;
          pmVar11 = std::
                    map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
                    ::operator[](&t.uvs,(key_type *)tf);
          auVar5 = local_1c8;
          pmVar11->x = (float)local_1c8._0_4_;
          pmVar11->y = (float)local_1c8._4_4_;
          local_1c8 = auVar5;
        }
        else {
          bVar6 = std::operator==(&local_188,"f");
          if (!bVar6) {
            bVar6 = std::operator==(&local_188,"l");
            if (!bVar6) {
              bVar6 = std::operator==(&local_188,"p");
              if (!bVar6) goto LAB_0050d684;
            }
          }
          bVar6 = std::operator==(&local_188,"f");
          uVar13 = 3;
          if (!bVar6) {
            bVar6 = std::operator==(&local_188,"l");
            uVar13 = bVar6 + 1;
          }
          tf[0].has_uv = false;
          tf[0].has_normal = false;
          tf[0].normal.y = 0.0;
          tf[0].normal.z = 0.0;
          tf[0].uv.x = 0.0;
          tf[0].uv.y = 0.0;
          tf[0].pos.x = 0.0;
          tf[0].pos.y = 0.0;
          tf[0].pos.z = 0.0;
          tf[0].normal.x = 0.0;
          tf[1].normal.y = 0.0;
          tf[1].normal.z = 0.0;
          tf[1].uv.x = 0.0;
          tf[1].uv.y = 0.0;
          tf[1].pos.x = 0.0;
          tf[1].pos.y = 0.0;
          tf[1].pos.z = 0.0;
          tf[1].normal.x = 0.0;
          tf[1].has_uv = false;
          tf[1].has_normal = false;
          tf[2].normal.y = 0.0;
          tf[2].normal.z = 0.0;
          tf[2].uv.x = 0.0;
          tf[2].uv.y = 0.0;
          tf[2].pos.x = 0.0;
          tf[2].pos.y = 0.0;
          tf[2].pos.z = 0.0;
          tf[2].normal.x = 0.0;
          tf[2].has_uv = false;
          tf[2].has_normal = false;
          uVar14 = 0;
          uVar18 = 0;
          cVar15 = '\0';
          local_1c8._0_4_ = 0xffffffff;
          vcount = uVar13;
          while( true ) {
            bVar6 = ReadElementUpToClosing
                              (this,(char *)CONCAT44(local_188._M_dataplus._M_p._4_4_,
                                                     (uint)local_188._M_dataplus._M_p));
            if (!bVar6) break;
            GetElementName_abi_cxx11_((string *)&meshId,this);
            bVar6 = std::operator==((string *)&meshId,"fv1");
            if (bVar6) {
LAB_0050d417:
              cVar15 = '\x01';
              ReadFaceVertex(this,&t,tf);
            }
            else {
              bVar6 = std::operator==((string *)&meshId,"lv1");
              if (bVar6) goto LAB_0050d417;
              bVar6 = std::operator==((string *)&meshId,"pv1");
              if (bVar6) goto LAB_0050d417;
              bVar6 = std::operator==((string *)&meshId,"fv2");
              if (bVar6) {
LAB_0050d464:
                uVar14 = 1;
                ReadFaceVertex(this,&t,tf + 1);
              }
              else {
                bVar6 = std::operator==((string *)&meshId,"lv2");
                if (bVar6) goto LAB_0050d464;
                bVar6 = std::operator==((string *)&meshId,"fv3");
                if (bVar6) {
                  uVar18 = 1;
                  ReadFaceVertex(this,&t,tf + 2);
                }
                else {
                  bVar6 = std::operator==((string *)&meshId,"mat");
                  if (!bVar6) {
                    bVar6 = std::operator==((string *)&meshId,"matref");
                    if (!bVar6) goto LAB_0050d42f;
                  }
                  if (local_1c8._0_4_ != -1) {
                    LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x50d4e8);
                  }
                  uVar13 = ResolveMaterialRef(this,local_1b0);
                  local_1c8._0_4_ = uVar13;
                }
              }
            }
LAB_0050d42f:
            std::__cxx11::string::~string((string *)&meshId);
          }
          local_1d3[2] = uVar18;
          local_1d3[1] = uVar14;
          local_1d3[0] = cVar15;
          if (local_1c8._0_4_ == -1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&meshId,"missing material index",&local_1d4);
            LogFunctions<Assimp::XGLImporter>::ThrowException((string *)&meshId);
            std::__cxx11::string::~string((string *)&meshId);
          }
          pbVar16 = &tf[0].has_normal;
          uVar17 = 0;
          uVar13 = 0;
          for (uVar19 = 0; uVar19 < vcount; uVar19 = uVar19 + 1) {
            if (local_1d3[uVar19] == '\0') {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&meshId,"missing face vertex data",&local_1d4);
              LogFunctions<Assimp::XGLImporter>::ThrowException((string *)&meshId);
              std::__cxx11::string::~string((string *)&meshId);
            }
            uVar9 = 1;
            uVar3 = uVar17 & 1;
            uVar17 = 1;
            if (uVar3 == 0) {
              uVar17 = (uint)*pbVar16;
            }
            if ((uVar13 & 1) == 0) {
              uVar9 = (uint)pbVar16[-1];
            }
            pbVar16 = pbVar16 + 0x24;
            uVar13 = uVar9;
          }
          uVar4 = local_1c8._0_4_;
          if (0x3fffffff < (uint)local_1c8._0_4_) {
            LogFunctions<Assimp::XGLImporter>::LogWarn((char *)0x50d5c2);
          }
          meshId = (uVar13 & 1) << 0x1e | uVar17 << 0x1f | uVar4;
          this_01 = std::
                    map<unsigned_int,_Assimp::XGLImporter::TempMaterialMesh,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::XGLImporter::TempMaterialMesh>_>_>
                    ::operator[](&bymat,&meshId);
          this_01->matid = uVar4;
          local_1c8._0_8_ = &this_01->normals;
          local_1b8 = &this_01->uvs;
          __x = tf;
          for (uVar19 = 0; uVar19 < vcount; uVar19 = uVar19 + 1) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      (&this_01->positions,&__x->pos);
            if ((uVar17 & 1) != 0) {
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         local_1c8._0_8_,&__x->normal);
            }
            if ((uVar13 & 1) != 0) {
              std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back
                        (local_1b8,&__x->uv);
            }
            this_01->pflags = this_01->pflags | 1 << ((char)vcount - 1U & 0x1f);
            __x = __x + 1;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this_01->vcounts,&vcount);
        }
      }
    }
LAB_0050d684:
    std::__cxx11::string::~string((string *)&local_188);
  } while( true );
}

Assistant:

bool XGLImporter::ReadMesh(TempScope& scope)
{
    TempMesh t;

    std::map<unsigned int, TempMaterialMesh> bymat;
    const unsigned int mesh_id = ReadIDAttr();

    while (ReadElementUpToClosing("mesh"))  {
        const std::string& s = GetElementName();

        if (s == "mat") {
            ReadMaterial(scope);
        }
        else if (s == "p") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <p>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.points[id] = ReadVec3();
            }
        }
        else if (s == "n") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <n>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.normals[id] = ReadVec3();
            }
        }
        else if (s == "tc") {
            if (!m_reader->getAttributeValue("ID")) {
                LogWarn("no ID attribute on <tc>, ignoring");
            }
            else {
                int id = m_reader->getAttributeValueAsInt("ID");
                t.uvs[id] = ReadVec2();
            }
        }
        else if (s == "f" || s == "l" || s == "p") {
            const unsigned int vcount = s == "f" ? 3 : (s == "l" ? 2 : 1);

            unsigned int mid = ~0u;
            TempFace tf[3];
            bool has[3] = {0};

            while (ReadElementUpToClosing(s.c_str()))   {
                const std::string& s = GetElementName();
                if (s == "fv1" || s == "lv1" || s == "pv1") {
                    ReadFaceVertex(t,tf[0]);
                    has[0] = true;
                }
                else if (s == "fv2" || s == "lv2") {
                    ReadFaceVertex(t,tf[1]);
                    has[1] = true;
                }
                else if (s == "fv3") {
                    ReadFaceVertex(t,tf[2]);
                    has[2] = true;
                }
                else if (s == "mat") {
                    if (mid != ~0u) {
                        LogWarn("only one material tag allowed per <f>");
                    }
                    mid = ResolveMaterialRef(scope);
                }
                else if (s == "matref") {
                    if (mid != ~0u) {
                        LogWarn("only one material tag allowed per <f>");
                    }
                    mid = ResolveMaterialRef(scope);
                }
            }

            if (mid == ~0u) {
                ThrowException("missing material index");
            }

            bool nor = false;
            bool uv = false;
            for(unsigned int i = 0; i < vcount; ++i) {
                if (!has[i]) {
                    ThrowException("missing face vertex data");
                }

                nor = nor || tf[i].has_normal;
                uv = uv || tf[i].has_uv;
            }

            if (mid >= (1<<30)) {
                LogWarn("material indices exhausted, this may cause errors in the output");
            }
            unsigned int meshId = mid | ((nor?1:0)<<31) | ((uv?1:0)<<30);

            TempMaterialMesh& mesh = bymat[meshId];
            mesh.matid = mid;

            for(unsigned int i = 0; i < vcount; ++i) {
                mesh.positions.push_back(tf[i].pos);
                if(nor) {
                    mesh.normals.push_back(tf[i].normal);
                }
                if(uv) {
                    mesh.uvs.push_back(tf[i].uv);
                }

                mesh.pflags |= 1 << (vcount-1);
            }

            mesh.vcounts.push_back(vcount);
        }
    }

    // finally extract output meshes and add them to the scope
    typedef std::pair<unsigned int, TempMaterialMesh> pairt;
    for(const pairt& p : bymat) {
        aiMesh* const m  = ToOutputMesh(p.second);
        scope.meshes_linear.push_back(m);

        // if this is a definition, keep it on the stack
        if(mesh_id != ~0u) {
            scope.meshes.insert(std::pair<unsigned int, aiMesh*>(mesh_id,m));
        }
    }

    // no id == not a reference, insert this mesh right *here*
    return mesh_id == ~0u;
}